

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,___gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,_false,_(pybind11::return_value_policy)6>_>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,___gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,_false,_(pybind11::return_value_policy)6>,_std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,___gnu_cxx::__normal_iterator<TangleView_*,_std::vector<TangleView,_std::allocator<TangleView>_>_>,_false,_(pybind11::return_value_policy)6>_>_>
  *this;
  long in_RDX;
  value_and_holder *in_RSI;
  long in_RDI;
  pointer in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      this = pybind11::detail::value_and_holder::
             holder<std::unique_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>,std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>>>>
                       (in_RSI);
      pybind11::detail::value_and_holder::
      value_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>>
                (in_RSI);
      std::
      unique_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>,std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>>>
      ::
      unique_ptr<std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,__gnu_cxx::__normal_iterator<TangleView*,std::vector<TangleView,std::allocator<TangleView>>>,false,(pybind11::return_value_policy)6>>,void>
                (this,in_stack_ffffffffffffffc8);
      pybind11::detail::value_and_holder::set_holder_constructed(in_RSI,true);
    }
  }
  else {
    init_holder_from_existing(in_RSI,in_RDX);
    pybind11::detail::value_and_holder::set_holder_constructed(in_RSI,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }